

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int on_ack_stream(quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent)

{
  size_t *conn;
  st_quicly_sent_block_t *stream_id;
  uint64_t uVar1;
  int iVar2;
  quicly_stream_t *stream;
  
  conn = &map[-0x28].num_packets;
  if (acked == 0) {
    stream = quicly_get_stream((quicly_conn_t *)conn,(sent->data).stream.stream_id);
    if (stream != (quicly_stream_t *)0x0) {
      iVar2 = quicly_sendstate_lost(&stream->sendstate,&(sent->data).stream.args);
      if (iVar2 != 0) {
        return iVar2;
      }
      if ((stream->_send_aux).reset_stream.sender_state == QUICLY_SENDER_STATE_NONE) {
        resched_stream_data(stream);
      }
    }
  }
  else if ((((packet->field_0x11 & 2) == 0) ||
           (map[0x17].tail != (st_quicly_sent_block_t *)(sent->data).packet.packet_number)) ||
          (map[0x17].bytes_in_flight != (sent->data).packet.sent_at)) {
    iVar2 = on_ack_stream_ack_one
                      ((quicly_conn_t *)conn,(quicly_stream_id_t)map[0x17].tail,
                       (quicly_sendstate_sent_t *)&map[0x17].num_packets);
    map[0x17].tail = (st_quicly_sent_block_t *)0x8000000000000000;
    if (iVar2 != 0) {
      return iVar2;
    }
    stream_id = (st_quicly_sent_block_t *)(sent->data).stream.stream_id;
    if ((packet->field_0x11 & 2) == 0) {
      iVar2 = on_ack_stream_ack_one
                        ((quicly_conn_t *)conn,(quicly_stream_id_t)stream_id,
                         &(sent->data).stream.args);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    else {
      map[0x17].tail = stream_id;
      uVar1 = (sent->data).stream.args.end;
      map[0x17].num_packets = (sent->data).packet.sent_at;
      map[0x17].bytes_in_flight = uVar1;
    }
  }
  else {
    map[0x17].bytes_in_flight = (sent->data).stream.args.end;
  }
  return 0;
}

Assistant:

static int on_ack_stream(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    int ret;

    if (acked) {

        QUICLY_PROBE(STREAM_ACKED, conn, conn->stash.now, sent->data.stream.stream_id, sent->data.stream.args.start,
                     sent->data.stream.args.end - sent->data.stream.args.start);

        if (packet->frames_in_flight && conn->stash.on_ack_stream.active_acked_cache.stream_id == sent->data.stream.stream_id &&
            conn->stash.on_ack_stream.active_acked_cache.args.end == sent->data.stream.args.start) {
            /* Fast path: append the newly supplied range to the existing cached range. */
            conn->stash.on_ack_stream.active_acked_cache.args.end = sent->data.stream.args.end;
        } else {
            /* Slow path: submit the cached range, and if possible, cache the newly supplied range. Else submit the newly supplied
             * range directly. */
            if ((ret = on_ack_stream_ack_cached(conn)) != 0)
                return ret;
            if (packet->frames_in_flight) {
                conn->stash.on_ack_stream.active_acked_cache.stream_id = sent->data.stream.stream_id;
                conn->stash.on_ack_stream.active_acked_cache.args = sent->data.stream.args;
            } else {
                if ((ret = on_ack_stream_ack_one(conn, sent->data.stream.stream_id, &sent->data.stream.args)) != 0)
                    return ret;
            }
        }

    } else {

        QUICLY_PROBE(STREAM_LOST, conn, conn->stash.now, sent->data.stream.stream_id, sent->data.stream.args.start,
                     sent->data.stream.args.end - sent->data.stream.args.start);

        quicly_stream_t *stream;
        if ((stream = quicly_get_stream(conn, sent->data.stream.stream_id)) == NULL)
            return 0;
        /* FIXME handle rto error */
        if ((ret = quicly_sendstate_lost(&stream->sendstate, &sent->data.stream.args)) != 0)
            return ret;
        if (stream->_send_aux.reset_stream.sender_state == QUICLY_SENDER_STATE_NONE)
            resched_stream_data(stream);
    }

    return 0;
}